

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.cpp
# Opt level: O0

void * MissionLogThread(void *pParam)

{
  double long_env;
  double alt_env;
  FILE *__stream;
  double x;
  double y;
  double z;
  double dVar1;
  double dVar2;
  double depthhat;
  double althat;
  double longhat;
  double lathat;
  void *pParam_local;
  
  longhat = 0.0;
  althat = 0.0;
  depthhat = 0.0;
  lathat = (double)pParam;
  do {
    mSleep(100);
    EnterCriticalSection(&MissionFilesCS);
    if ((bMissionRunning != 0) && (logmissionfile != (FILE *)0x0)) {
      EnterCriticalSection(&StateVariablesCS);
      alt_env = ::alt_env;
      long_env = ::long_env;
      dVar2 = lat_env;
      dVar1 = angle_env;
      x = Center((interval *)&xhat);
      y = Center((interval *)&yhat);
      z = Center((interval *)&zhat);
      EnvCoordSystem2GPS(dVar2,long_env,alt_env,dVar1,x,y,z,&longhat,&althat,&depthhat);
      dVar1 = Center((interval *)&zhat);
      LeaveCriticalSection(&StateVariablesCS);
      __stream = logmissionfile;
      dVar2 = GetTimeElapsedChronoQuick(&chrono_mission);
      fprintf((FILE *)__stream,"%f;%f;%f;%f;%s;\n",dVar2,longhat,althat,-dVar1,szAction);
      fflush((FILE *)logmissionfile);
    }
    LeaveCriticalSection(&MissionFilesCS);
  } while (bExit == 0);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE MissionLogThread(void* pParam)
{
	double lathat = 0, longhat = 0, althat = 0, depthhat = 0;

	UNREFERENCED_PARAMETER(pParam);

	for (;;)
	{
		mSleep(100);

		EnterCriticalSection(&MissionFilesCS);
		if (bMissionRunning&&(logmissionfile != NULL))
		{
			EnterCriticalSection(&StateVariablesCS);
			EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(xhat), Center(yhat), Center(zhat), &lathat, &longhat, &althat);
			depthhat = -Center(zhat);
			LeaveCriticalSection(&StateVariablesCS);

			// szAction is not protected and might be temporarily invalid when it is changing, 
			// but this should not cause a crash...

			fprintf(logmissionfile, "%f;%f;%f;%f;%s;\n",
				GetTimeElapsedChronoQuick(&chrono_mission), lathat, longhat, depthhat, szAction
			);
			fflush(logmissionfile);
		}
		LeaveCriticalSection(&MissionFilesCS);

		if (bExit) break;
	}

	return 0;
}